

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O0

uint32_t __thiscall Shader::create_shader(Shader *this,char *source,uint32_t type)

{
  GLuint object;
  GLuint shader;
  GLchar *local_48;
  char *text_c;
  string text;
  uint32_t type_local;
  char *source_local;
  Shader *this_local;
  
  text.field_2._12_4_ = type;
  load_file_abi_cxx11_((string *)&text_c,source);
  local_48 = (GLchar *)std::__cxx11::string::data();
  fix_version(this,(string *)&text_c);
  object = (*glad_glCreateShader)(text.field_2._12_4_);
  (*glad_glShaderSource)(object,1,&local_48,(GLint *)0x0);
  (*glad_glCompileShader)(object);
  check_errors(this,object,1);
  std::__cxx11::string::~string((string *)&text_c);
  return object;
}

Assistant:

uint32_t Shader::create_shader(const char *source, uint32_t type)
{
    std::string text = load_file(source);
    const char* text_c = text.data();

    fix_version(text);

    GLuint shader = glCreateShader(type);
    glShaderSource(shader, 1, &text_c, nullptr);
    glCompileShader(shader);

    // Check any compilation errors
    check_errors(shader, COMPILE_ERRORS);

    return shader;
}